

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.cpp
# Opt level: O1

void duckdb::ReplaceFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  anon_union_16_2_67f50693_for_value *paVar3;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  reference this_00;
  reference this_01;
  reference this_02;
  ValidityMask *pVVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  ValidityMask *pVVar9;
  ValidityMask *pVVar10;
  idx_t idx_in_entry;
  ValidityMask *pVVar11;
  data_ptr_t pdVar12;
  anon_class_16_2_52ce5e5c fun;
  anon_class_16_2_52ce5e5c fun_00;
  anon_class_16_2_52ce5e5c fun_01;
  string_t sVar13;
  anon_struct_16_3_d7536bce_for_pointer aVar14;
  string_t a;
  string_t b;
  string_t b_00;
  vector<char,_true> buffer;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  ValidityMask *mask;
  idx_t in_stack_fffffffffffffea0;
  data_ptr_t pdVar15;
  vector<char,_true> local_148;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  buffer_ptr<ValidityBuffer> *local_118;
  idx_t local_110;
  UnifiedVectorFormat local_108;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  this_00 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  this_01 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  this_02 = vector<duckdb::Vector,_true>::operator[](&args->data,2);
  local_148.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_148.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_148.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  mask = (ValidityMask *)args->count;
  if (((this_00->vector_type == CONSTANT_VECTOR) && (this_01->vector_type == CONSTANT_VECTOR)) &&
     (this_02->vector_type == CONSTANT_VECTOR)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar2 = (this_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) &&
        ((puVar2 = (this_01->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
         puVar2 == (unsigned_long *)0x0 || ((*puVar2 & 1) != 0)))) &&
       ((puVar2 = (this_02->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar2 == (unsigned_long *)0x0 || ((*puVar2 & 1) != 0)))) {
      paVar3 = (anon_union_16_2_67f50693_for_value *)result->data;
      fun_01.buffer = &local_148;
      fun_01.result = result;
      aVar14 = (anon_struct_16_3_d7536bce_for_pointer)
               TernaryLambdaWrapper::
               Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         (fun_01,(string_t)
                                 ((anon_union_16_2_67f50693_for_value *)this_00->data)->pointer,
                          (string_t)((anon_union_16_2_67f50693_for_value *)this_01->data)->pointer,
                          (string_t)((anon_union_16_2_67f50693_for_value *)this_02->data)->pointer,
                          mask,in_stack_fffffffffffffea0);
      paVar3->pointer = aVar14;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
    Vector::ToUnifiedFormat(this_00,(idx_t)mask,&local_78);
    Vector::ToUnifiedFormat(this_01,(idx_t)mask,&local_c0);
    Vector::ToUnifiedFormat(this_02,(idx_t)mask,&local_108);
    pdVar12 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) &&
        (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0)) &&
       (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0)) {
      if (mask != (ValidityMask *)0x0) {
        pdVar12 = pdVar12 + 8;
        pVVar11 = (ValidityMask *)0x0;
        pdVar15 = local_108.data;
        do {
          pVVar7 = pVVar11;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            pVVar7 = (ValidityMask *)(ulong)(local_78.sel)->sel_vector[(long)pVVar11];
          }
          pVVar9 = pVVar11;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            pVVar9 = (ValidityMask *)(ulong)(local_c0.sel)->sel_vector[(long)pVVar11];
          }
          pVVar10 = pVVar11;
          if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
            pVVar10 = (ValidityMask *)(ulong)(local_108.sel)->sel_vector[(long)pVVar11];
          }
          fun.buffer = &local_148;
          fun.result = result;
          a.value.pointer.ptr = (char *)*(undefined8 *)(local_78.data + (long)pVVar7 * 0x10 + 8);
          a.value._0_8_ = *(undefined8 *)(local_78.data + (long)pVVar7 * 0x10);
          b.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + (long)pVVar9 * 0x10 + 8);
          b.value._0_8_ = *(undefined8 *)(local_c0.data + (long)pVVar9 * 0x10);
          sVar13 = TernaryLambdaWrapper::
                   Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                             (fun,a,b,(string_t)
                                      ((anon_union_16_2_67f50693_for_value *)
                                      (pdVar15 + (long)pVVar10 * 0x10))->pointer,mask,(idx_t)pdVar15
                             );
          *(long *)(pdVar12 + -8) = sVar13.value._0_8_;
          *(long *)pdVar12 = sVar13.value._8_8_;
          pVVar11 = (ValidityMask *)
                    ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
          ;
          pdVar12 = pdVar12 + 0x10;
        } while (mask != pVVar11);
      }
    }
    else if (mask != (ValidityMask *)0x0) {
      local_118 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      pdVar12 = pdVar12 + 8;
      pVVar11 = (ValidityMask *)0x0;
      pdVar15 = local_108.data;
      do {
        pVVar7 = pVVar11;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          pVVar7 = (ValidityMask *)(ulong)(local_78.sel)->sel_vector[(long)pVVar11];
        }
        pVVar9 = pVVar11;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          pVVar9 = (ValidityMask *)(ulong)(local_c0.sel)->sel_vector[(long)pVVar11];
        }
        pVVar10 = pVVar11;
        if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
          pVVar10 = (ValidityMask *)(ulong)(local_108.sel)->sel_vector[(long)pVVar11];
        }
        if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
              [(ulong)pVVar7 >> 6] >> ((ulong)pVVar7 & 0x3f) & 1) != 0)) &&
           (((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [(ulong)pVVar9 >> 6] >> ((ulong)pVVar9 & 0x3f) & 1) != 0)) &&
            ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [(ulong)pVVar10 >> 6] >> ((ulong)pVVar10 & 0x3f) & 1) != 0)))))) {
          fun_00.buffer = &local_148;
          fun_00.result = result;
          sVar13.value.pointer.ptr =
               (char *)*(undefined8 *)(local_78.data + (long)pVVar7 * 0x10 + 8);
          sVar13.value._0_8_ = *(undefined8 *)(local_78.data + (long)pVVar7 * 0x10);
          b_00.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + (long)pVVar9 * 0x10 + 8);
          b_00.value._0_8_ = *(undefined8 *)(local_c0.data + (long)pVVar9 * 0x10);
          sVar13 = TernaryLambdaWrapper::
                   Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                             (fun_00,sVar13,b_00,
                              (string_t)
                              ((anon_union_16_2_67f50693_for_value *)
                              (pdVar15 + (long)pVVar10 * 0x10))->pointer,mask,(idx_t)pdVar15);
          *(long *)(pdVar12 + -8) = sVar13.value._0_8_;
          *(long *)pdVar12 = sVar13.value._8_8_;
        }
        else {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_110 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_128,&local_110);
            p_Var6 = p_Stack_120;
            peVar5 = local_128;
            local_128 = (element_type *)0x0;
            p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (local_118);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar4 = (byte)pVVar11 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   ((ulong)pVVar11 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        }
        pVVar11 = (ValidityMask *)
                  ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
        pdVar12 = pdVar12 + 0x10;
      } while (mask != pVVar11);
    }
    if (local_108.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_c0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (local_148.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_148.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start);
  }
  return;
}

Assistant:

static void ReplaceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &haystack_vector = args.data[0];
	auto &needle_vector = args.data[1];
	auto &thread_vector = args.data[2];

	vector<char> buffer;
	TernaryExecutor::Execute<string_t, string_t, string_t, string_t>(
	    haystack_vector, needle_vector, thread_vector, result, args.size(),
	    [&](string_t input_string, string_t needle_string, string_t thread_string) {
		    return StringVector::AddString(result,
		                                   ReplaceScalarFunction(input_string, needle_string, thread_string, buffer));
	    });
}